

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O2

void __thiscall EditDistance::updateDpPosition(EditDistance *this,int i,int j,int d)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  IntView<0> *jVar;
  IntView<0> *iVar;
  
  if (j == 0 && i == 0) {
    return;
  }
  uVar1 = j - 1;
  jVar = this->seq2 + (long)j + -1;
  if (i == 0) {
    iVar5 = getMinimumInsertionCosts(this,jVar);
    piVar7 = (this->dpMatrix).data;
    iVar5 = iVar5 + piVar7[uVar1];
    goto LAB_001589f8;
  }
  iVar2 = i + -1;
  iVar = this->seq1 + (long)i + -1;
  if (j == 0) {
    iVar5 = getMinimumDeletionCosts(this,iVar);
    iVar6 = this->seqSize + 1;
    piVar7 = (this->dpMatrix).data;
    iVar5 = iVar5 + piVar7[(uint)(iVar2 * iVar6)];
    j = iVar6 * i;
    goto LAB_001589f8;
  }
  iVar6 = this->seqSize;
  iVar5 = this->max_id_cost * iVar6 * 2;
  if (i - d < j) {
    iVar4 = getMinimumInsertionCosts(this,jVar);
    iVar6 = this->seqSize;
    iVar4 = iVar4 + (this->dpMatrix).data[(iVar6 + 1) * i + uVar1];
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
  }
  if (j < d + i) {
    iVar4 = getMinimumDeletionCosts(this,iVar);
    iVar6 = this->seqSize;
    iVar4 = iVar4 + (this->dpMatrix).data[(uint)((iVar6 + 1) * iVar2 + j)];
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
  }
  iVar4 = (iVar->var->min).v;
  if (iVar4 == (iVar->var->max).v) {
    iVar3 = (jVar->var->min).v;
    if ((iVar4 != iVar3) || (iVar3 != (jVar->var->max).v)) goto LAB_0015899e;
    iVar6 = iVar6 + 1;
    piVar7 = (this->dpMatrix).data;
    iVar4 = piVar7[iVar2 * iVar6 + uVar1];
  }
  else {
LAB_0015899e:
    iVar4 = getMinimumSubstitutionCost(this,iVar,jVar);
    iVar6 = this->seqSize + 1;
    piVar7 = (this->dpMatrix).data;
    iVar4 = iVar4 + piVar7[iVar2 * iVar6 + uVar1];
  }
  if (iVar4 < iVar5) {
    iVar5 = iVar4;
  }
  j = iVar6 * i + j;
LAB_001589f8:
  piVar7[(uint)j] = iVar5;
  return;
}

Assistant:

void updateDpPosition(int i, int j, int d) {
		IntView<>* const iVar = &seq1[i - 1];
		IntView<>* const jVar = &seq2[j - 1];

		if (i == 0 && j == 0) {
			// top left position is always 0
		} else if (i == 0) {
			const int min_insertion_costs = getMinimumInsertionCosts(jVar);
			dpMatrix[matrixCoord(i, j)] = dpMatrix[matrixCoord(0, j - 1)] + min_insertion_costs;
		} else if (j == 0) {
			const int min_deletion_costs = getMinimumDeletionCosts(iVar);
			dpMatrix[matrixCoord(i, j)] = dpMatrix[matrixCoord(i - 1, 0)] + min_deletion_costs;
		} else {
			int minChange = seqSize * 2 * max_id_cost;

			if (j - 1 >= i - d) {
				const int min_insertion_costs = getMinimumInsertionCosts(jVar);
				minChange = std::min(minChange, dpMatrix[matrixCoord(i, j - 1)] + min_insertion_costs);
			}
			if (j < i + d) {
				const int min_deletion_costs = getMinimumDeletionCosts(iVar);
				minChange = std::min(minChange, dpMatrix[matrixCoord(i - 1, j)] + min_deletion_costs);
			}

			if (iVar->isFixed() && jVar->isFixed() && iVar->getVal() == jVar->getVal()) {
				// both values fixed and equal
				minChange = std::min(minChange, dpMatrix[matrixCoord(i - 1, j - 1)]);
			} else {
				const int minDiagonalCost = getMinimumSubstitutionCost(iVar, jVar);
				const int diagonalCost = dpMatrix[matrixCoord(i - 1, j - 1)] + minDiagonalCost;
				minChange = std::min(minChange, diagonalCost);
			}
			dpMatrix[matrixCoord(i, j)] = minChange;
		}
	}